

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_truncate(Pager *pPager,Pgno nPage)

{
  sqlite3_file *psVar1;
  i64 iVar2;
  char *__s;
  sqlite3_io_methods *psVar3;
  int iVar4;
  int iVar5;
  i64 newSize;
  i64 currentSize;
  long local_30;
  long local_28;
  size_t __n;
  
  psVar1 = pPager->fd;
  iVar4 = 0;
  if ((psVar1->pMethods != (sqlite3_io_methods *)0x0) &&
     (iVar4 = 0, (byte)(pPager->eState - 4) < 0xfd)) {
    iVar2 = pPager->pageSize;
    iVar4 = (*psVar1->pMethods->xFileSize)(psVar1,&local_28);
    iVar5 = (int)iVar2;
    __n = (size_t)iVar5;
    local_30 = nPage * __n;
    if (iVar4 == 0) {
      iVar4 = 0;
      if (local_28 != local_30) {
        if (local_30 < local_28) {
          iVar4 = (*pPager->fd->pMethods->xTruncate)(pPager->fd,local_30);
        }
        else {
          iVar4 = 0;
          if ((long)(local_28 + __n) <= local_30) {
            __s = pPager->pTmpSpace;
            memset(__s,0,__n);
            psVar3 = pPager->fd->pMethods;
            if (psVar3 != (sqlite3_io_methods *)0x0) {
              (*psVar3->xFileControl)(pPager->fd,5,&local_30);
            }
            iVar4 = (*pPager->fd->pMethods->xWrite)(pPager->fd,__s,iVar5,local_30 - __n);
          }
        }
        if (iVar4 == 0) {
          pPager->dbFileSize = nPage;
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int pager_truncate(Pager *pPager, Pgno nPage){
  int rc = SQLITE_OK;
  assert( pPager->eState!=PAGER_ERROR );
  assert( pPager->eState!=PAGER_READER );

  if( isOpen(pPager->fd)
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    i64 currentSize, newSize;
    int szPage = pPager->pageSize;
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    /* TODO: Is it safe to use Pager.dbFileSize here? */
    rc = sqlite3OsFileSize(pPager->fd, &currentSize);
    newSize = szPage*(i64)nPage;
    if( rc==SQLITE_OK && currentSize!=newSize ){
      if( currentSize>newSize ){
        rc = sqlite3OsTruncate(pPager->fd, newSize);
      }else if( (currentSize+szPage)<=newSize ){
        char *pTmp = pPager->pTmpSpace;
        memset(pTmp, 0, szPage);
        testcase( (newSize-szPage) == currentSize );
        testcase( (newSize-szPage) >  currentSize );
        sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_SIZE_HINT, &newSize);
        rc = sqlite3OsWrite(pPager->fd, pTmp, szPage, newSize-szPage);
      }
      if( rc==SQLITE_OK ){
        pPager->dbFileSize = nPage;
      }
    }
  }
  return rc;
}